

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int RWops12to20_close(SDL_RWops *rwops20)

{
  Uint8 *pUVar1;
  SDL12_RWops *rwops12;
  int rc;
  SDL_RWops *rwops20_local;
  
  rwops12._4_4_ = 0;
  if (rwops20 != (SDL_RWops *)0x0) {
    pUVar1 = (rwops20->hidden).mem.base;
    rwops12._4_4_ = (**(code **)(pUVar1 + 0x18))(pUVar1);
    (*SDL20_FreeRW)(rwops20);
  }
  return rwops12._4_4_;
}

Assistant:

static int SDLCALL
RWops12to20_close(struct SDL_RWops *rwops20)
{
    int rc = 0;
    if (rwops20) {
        SDL12_RWops *rwops12 = (SDL12_RWops *) rwops20->hidden.unknown.data1;
        rc = rwops12->close(rwops12);
        SDL20_FreeRW(rwops20);
    }
    return rc;
}